

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.hpp
# Opt level: O3

int doctest::detail::wildcmp(char *str,char *wild,bool caseSensitive)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char cVar7;
  
  cVar3 = *str;
  while (cVar3 != '\0') {
    cVar1 = *wild;
    if (cVar1 == '*') {
      pcVar4 = (char *)0x0;
      pcVar5 = (char *)0x0;
      goto LAB_0010599a;
    }
    if (caseSensitive) {
      if (cVar1 != '?' && cVar1 != cVar3) {
        return 0;
      }
    }
    else {
      cVar7 = cVar1 + ' ';
      if (0x19 < (byte)(cVar1 + 0xbfU)) {
        cVar7 = cVar1;
      }
      cVar2 = cVar3 + ' ';
      if (0x19 < (byte)(cVar3 + 0xbfU)) {
        cVar2 = cVar3;
      }
      if ((cVar1 != '?') && (cVar7 != cVar2)) {
        return 0;
      }
    }
    wild = wild + 1;
    pcVar5 = str + 1;
    str = str + 1;
    cVar3 = *pcVar5;
  }
  goto LAB_00105a26;
LAB_0010599a:
  do {
    cVar1 = *wild;
    if (cVar1 == '*') {
      if (wild[1] == '\0') {
        return 1;
      }
      pcVar4 = wild + 1;
      wild = pcVar4;
      pcVar6 = str + 1;
    }
    else {
      if (caseSensitive) {
        if (cVar1 != '?' && cVar1 != cVar3) {
LAB_00105a0b:
          pcVar6 = pcVar5 + 1;
          wild = pcVar4;
          str = pcVar5;
          goto LAB_00105a1c;
        }
      }
      else {
        cVar7 = cVar1 + ' ';
        if (0x19 < (byte)(cVar1 + 0xbfU)) {
          cVar7 = cVar1;
        }
        cVar2 = cVar3 + ' ';
        if (0x19 < (byte)(cVar3 + 0xbfU)) {
          cVar2 = cVar3;
        }
        if ((cVar1 != '?') && (cVar7 != cVar2)) goto LAB_00105a0b;
      }
      wild = wild + 1;
      str = str + 1;
      pcVar6 = pcVar5;
    }
LAB_00105a1c:
    cVar3 = *str;
    pcVar5 = pcVar6;
  } while (cVar3 != '\0');
LAB_00105a26:
  do {
    cVar3 = *wild;
    wild = wild + 1;
  } while (cVar3 == '*');
  return (uint)(cVar3 == '\0');
}

Assistant:

int wildcmp(const char* str, const char* wild, bool caseSensitive) {
        const char* cp = 0;
        const char* mp = 0;

        // rolled my own tolower() to not include more headers
        while((*str) && (*wild != '*')) {
            if((caseSensitive ? (*wild != *str) : (tolower(*wild) != tolower(*str))) &&
               (*wild != '?')) {
                return 0;
            }
            wild++;
            str++;
        }

        while(*str) {
            if(*wild == '*') {
                if(!*++wild) {
                    return 1;
                }
                mp = wild;
                cp = str + 1;
            } else if((caseSensitive ? (*wild == *str) : (tolower(*wild) == tolower(*str))) ||
                      (*wild == '?')) {
                wild++;
                str++;
            } else {
                wild = mp;
                str  = cp++;
            }
        }

        while(*wild == '*') {
            wild++;
        }
        return !*wild;
    }